

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_trigger_note(xm_context_t *ctx,xm_channel_context_t *ch,uint flags)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint in_EDX;
  xm_context_t *in_RSI;
  long in_RDI;
  float fVar4;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((in_EDX & 4) == 0) {
    (in_RSI->module).pattern_table[8] = '\0';
    (in_RSI->module).pattern_table[9] = '\0';
    (in_RSI->module).pattern_table[10] = '\0';
    (in_RSI->module).pattern_table[0xb] = '\0';
    (in_RSI->module).pattern_table[0x18] = '\x01';
  }
  lVar1._0_2_ = (in_RSI->module).num_instruments;
  lVar1._2_2_ = *(undefined2 *)&(in_RSI->module).field_0xa;
  lVar1._4_4_ = (in_RSI->module).frequency_type;
  if (lVar1 != 0) {
    if ((in_EDX & 1) == 0) {
      *(undefined4 *)((in_RSI->module).pattern_table + 0x1c) =
           *(undefined4 *)(*(long *)&(in_RSI->module).num_instruments + 0x14);
    }
    *(undefined4 *)((in_RSI->module).pattern_table + 0x20) =
         *(undefined4 *)(*(long *)&(in_RSI->module).num_instruments + 0x20);
  }
  if ((in_EDX & 8) == 0) {
    (in_RSI->module).pattern_table[0x26] = '\x01';
    (in_RSI->module).pattern_table[0x2c] = '\0';
    (in_RSI->module).pattern_table[0x2d] = '\0';
    (in_RSI->module).pattern_table[0x2e] = 0x80;
    (in_RSI->module).pattern_table[0x2f] = '?';
    (in_RSI->module).pattern_table[0x28] = '\0';
    (in_RSI->module).pattern_table[0x29] = '\0';
    (in_RSI->module).pattern_table[0x2a] = 0x80;
    (in_RSI->module).pattern_table[0x2b] = '?';
    (in_RSI->module).pattern_table[0x30] = '\0';
    (in_RSI->module).pattern_table[0x31] = '\0';
    (in_RSI->module).pattern_table[0x32] = '\0';
    (in_RSI->module).pattern_table[0x33] = '?';
    (in_RSI->module).pattern_table[0x36] = '\0';
    (in_RSI->module).pattern_table[0x37] = '\0';
    (in_RSI->module).pattern_table[0x34] = '\0';
    (in_RSI->module).pattern_table[0x35] = '\0';
  }
  (in_RSI->module).pattern_table[0x60] = '\0';
  (in_RSI->module).pattern_table[0x61] = '\0';
  (in_RSI->module).pattern_table[0x62] = '\0';
  (in_RSI->module).pattern_table[99] = '\0';
  (in_RSI->module).pattern_table[0x6c] = '\0';
  (in_RSI->module).pattern_table[0x6d] = '\0';
  (in_RSI->module).pattern_table[0x6e] = '\0';
  (in_RSI->module).pattern_table[0x6f] = '\0';
  (in_RSI->module).pattern_table[0x71] = '\0';
  (in_RSI->module).pattern_table[0x24] = '\0';
  (in_RSI->module).pattern_table[0x25] = '\0';
  if (((in_RSI->module).pattern_table[0x5c] & 1) != 0) {
    (in_RSI->module).pattern_table[0x5e] = '\0';
    (in_RSI->module).pattern_table[0x5f] = '\0';
  }
  if (((in_RSI->module).pattern_table[0x68] & 1) != 0) {
    (in_RSI->module).pattern_table[0x6a] = '\0';
  }
  if ((in_EDX & 2) == 0) {
    fVar4 = xm_period((xm_context_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0.0);
    *(float *)((in_RSI->module).pattern_table + 0xc) = fVar4;
    xm_update_frequency(in_RSI,(xm_channel_context_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  *(undefined8 *)((in_RSI->module).pattern_table + 0x78) = *(undefined8 *)(in_RDI + 0x148);
  lVar2._0_2_ = (in_RSI->module).length;
  lVar2._2_2_ = (in_RSI->module).restart_position;
  lVar2._4_2_ = (in_RSI->module).num_channels;
  lVar2._6_2_ = (in_RSI->module).num_patterns;
  if (lVar2 != 0) {
    *(undefined8 *)(*(long *)&in_RSI->module + 0xe0) = *(undefined8 *)(in_RDI + 0x148);
  }
  lVar3._0_2_ = (in_RSI->module).num_instruments;
  lVar3._2_2_ = *(undefined2 *)&(in_RSI->module).field_0xa;
  lVar3._4_4_ = (in_RSI->module).frequency_type;
  if (lVar3 != 0) {
    *(undefined8 *)(*(long *)&(in_RSI->module).num_instruments + 0x28) =
         *(undefined8 *)(in_RDI + 0x148);
  }
  return;
}

Assistant:

static void xm_trigger_note(xm_context_t* ctx, xm_channel_context_t* ch, unsigned int flags) {
	if(!(flags & XM_TRIGGER_KEEP_SAMPLE_POSITION)) {
		ch->sample_position = 0.f;
		ch->ping = true;
	}

	if(ch->sample != NULL) {
		if(!(flags & XM_TRIGGER_KEEP_VOLUME)) {
			ch->volume = ch->sample->volume;
		}

		ch->panning = ch->sample->panning;
	}

	if(!(flags & XM_TRIGGER_KEEP_ENVELOPE)) {
		ch->sustained = true;
		ch->fadeout_volume = ch->volume_envelope_volume = 1.0f;
		ch->panning_envelope_panning = .5f;
		ch->volume_envelope_frame_count = ch->panning_envelope_frame_count = 0;
	}
	ch->vibrato_note_offset = 0.f;
	ch->tremolo_volume = 0.f;
	ch->tremor_on = false;

	ch->autovibrato_ticks = 0;

	if(ch->vibrato_waveform_retrigger) {
		ch->vibrato_ticks = 0; /* XXX: should the waveform itself also
								* be reset to sine? */
	}
	if(ch->tremolo_waveform_retrigger) {
		ch->tremolo_ticks = 0;
	}

	if(!(flags & XM_TRIGGER_KEEP_PERIOD)) {
		ch->period = xm_period(ctx, ch->note);
		xm_update_frequency(ctx, ch);
	}

	ch->latest_trigger = ctx->generated_samples;
	if(ch->instrument != NULL) {
		ch->instrument->latest_trigger = ctx->generated_samples;
	}
	if(ch->sample != NULL) {
		ch->sample->latest_trigger = ctx->generated_samples;
	}
}